

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hh
# Opt level: O2

void __thiscall JSON::JSON_string::~JSON_string(JSON_string *this)

{
  ~JSON_string(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

~JSON_string() override = default;